

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

ColumnDataChunkIterationHelper * __thiscall
duckdb::ColumnDataCollection::Chunks
          (ColumnDataChunkIterationHelper *__return_storage_ptr__,ColumnDataCollection *this,
          vector<unsigned_long,_true> *column_ids)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start =
       (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ColumnDataChunkIterationHelper::ColumnDataChunkIterationHelper
            (__return_storage_ptr__,this,(vector<unsigned_long,_true> *)&local_28);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ColumnDataChunkIterationHelper ColumnDataCollection::Chunks(vector<column_t> column_ids) const {
	return ColumnDataChunkIterationHelper(*this, std::move(column_ids));
}